

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O1

SampledSpectrum __thiscall pbrt::MediumInteraction::sigma_n(MediumInteraction *this)

{
  undefined1 auVar1 [16];
  int i;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  SampledSpectrum SVar6;
  SampledSpectrum sigma_n;
  undefined1 local_18 [16];
  
  auVar4._0_4_ = (this->sigma_s).values.values[0] + (this->sigma_a).values.values[0];
  auVar4._4_4_ = (this->sigma_s).values.values[1] + (this->sigma_a).values.values[1];
  auVar4._8_4_ = (this->sigma_s).values.values[2] + (this->sigma_a).values.values[2];
  auVar4._12_4_ = (this->sigma_s).values.values[3] + (this->sigma_a).values.values[3];
  local_18 = vsubps_avx(*(undefined1 (*) [16])(this->sigma_maj).values.values,auVar4);
  if (sigma_n()::reg == '\0') {
    iVar2 = __cxa_guard_acquire(&sigma_n()::reg);
    if (iVar2 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)&sigma_n()::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&sigma_n()::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0x1e0) = *(long *)(in_FS_OFFSET + -0x1e0) + 1;
  lVar3 = 1;
  auVar5 = ZEXT464((uint)local_18._0_4_);
  do {
    auVar4 = vminss_avx(ZEXT416(*(uint *)(local_18 + lVar3 * 4)),auVar5._0_16_);
    auVar5 = ZEXT1664(auVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (auVar4._0_4_ < 0.0) {
    *(long *)(in_FS_OFFSET + -0x1e8) = *(long *)(in_FS_OFFSET + -0x1e8) + 1;
  }
  auVar4 = vmaxps_avx(local_18,ZEXT416(0) << 0x20);
  auVar1 = vshufpd_avx(auVar4,auVar4,1);
  SVar6.values.values._0_8_ = auVar4._0_8_;
  SVar6.values.values._8_8_ = auVar1._0_8_;
  return (SampledSpectrum)SVar6.values.values;
}

Assistant:

void SetIntersectionProperties(MaterialHandle mtl, LightHandle area,
                                   const MediumInterface *primitiveMediumInterface,
                                   MediumHandle rayMedium) {
        material = mtl;
        areaLight = area;
        CHECK_GE(Dot(n, shading.n), 0.);
        // Set medium properties at surface intersection
        if (primitiveMediumInterface && primitiveMediumInterface->IsMediumTransition())
            mediumInterface = primitiveMediumInterface;
        else
            medium = rayMedium;
    }